

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t c4::to_chars(void *param_1,ulong param_2)

{
  code *pcVar1;
  bool bVar2;
  void *__dest;
  size_t sVar3;
  size_t space;
  void *vptr;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  ulong local_38;
  void *local_30;
  
  local_38 = param_2;
  local_30 = param_1;
  __dest = std::align(in_stack_00000018,in_stack_00000010,&local_30,&local_38);
  if (__dest == (void *)0x0) {
    in_stack_00000018 = in_stack_00000010 + in_stack_00000018;
  }
  else {
    if ((__dest < param_1) || ((void *)((long)param_1 + param_2) < __dest)) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          sVar3 = (*pcVar1)();
          return sVar3;
        }
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x42f8,"ptr >= buf.begin() && ptr <= buf.end()");
    }
    in_stack_00000018 = (long)__dest + (in_stack_00000010 - (long)param_1);
    if (in_stack_00000018 <= param_2) {
      memcpy(__dest,vptr,in_stack_00000010);
    }
  }
  return in_stack_00000018;
}

Assistant:

size_t to_chars(substr buf, fmt::const_raw_wrapper r)
{
    void * vptr = buf.str;
    size_t space = buf.len;
    auto ptr = (decltype(buf.str)) std::align(r.alignment, r.len, vptr, space);
    if(ptr == nullptr)
    {
        // if it was not possible to align, return a conservative estimate
        // of the required space
        return r.alignment + r.len;
    }
    C4_CHECK(ptr >= buf.begin() && ptr <= buf.end());
    size_t sz = static_cast<size_t>(ptr - buf.str) + r.len;
    if(sz <= buf.len)
    {
        memcpy(ptr, r.buf, r.len);
    }
    return sz;
}